

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCastToDecimalCommaSeparated::Operation<duckdb::string_t,short>
          (TryCastToDecimalCommaSeparated *this,string_t input,int16_t *result,
          CastParameters *parameters,uint8_t width,uint8_t scale)

{
  bool bVar1;
  char *string_ptr;
  undefined8 local_10;
  char *local_8;
  
  local_8 = input.value._0_8_;
  string_ptr = (char *)((long)&local_10 + 4);
  if (0xc < ((ulong)this & 0xffffffff)) {
    string_ptr = local_8;
  }
  local_10 = this;
  bVar1 = TryDecimalStringCast<short,(char)44>
                    (string_ptr,(ulong)this & 0xffffffff,input.value._8_8_,(CastParameters *)result,
                     (uint8_t)parameters,width);
  return bVar1;
}

Assistant:

bool TryCastToDecimalCommaSeparated::Operation(string_t input, int16_t &result, CastParameters &parameters,
                                               uint8_t width, uint8_t scale) {
	return TryDecimalStringCast<int16_t, ','>(input, result, parameters, width, scale);
}